

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O0

unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
* __thiscall
gmlc::libguarded::detail::
allocate_unique<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node,std::allocator<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node>,int&>
          (unique_ptr<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node,_gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>_>
           *__return_storage_ptr__,detail *this,
          allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node> *alloc,
          int *args)

{
  pointer __p;
  deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>
  local_35 [13];
  pointer local_28;
  pointer p;
  int *args_local;
  allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node> *alloc_local;
  
  p = (pointer)alloc;
  args_local = (int *)this;
  alloc_local = (allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>
                 *)__return_storage_ptr__;
  local_28 = std::
             allocator_traits<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>
             ::allocate((allocator_type *)this,1);
  std::
  allocator_traits<std::allocator<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node>>
  ::construct<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node,int&>
            ((allocator_type *)args_local,local_28,(int *)p);
  __p = local_28;
  deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>
  ::deallocator(local_35,(allocator_type *)args_local);
  std::
  unique_ptr<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node,gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node>>>
  ::
  unique_ptr<gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node>>,void>
            ((unique_ptr<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node,gmlc::libguarded::detail::deallocator<std::allocator<gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::node>>>
              *)__return_storage_ptr__,__p,local_35);
  deallocator<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>_>
  ::~deallocator(local_35);
  return __return_storage_ptr__;
}

Assistant:

std::unique_ptr<T, deallocator<Alloc>> allocate_unique(Alloc& alloc,
                                                           Args&&... args)
    {
        using allocator_traits = std::allocator_traits<Alloc>;
        auto p = allocator_traits::allocate(alloc, 1);
        try {
            allocator_traits::construct(alloc, p, std::forward<Args>(args)...);
            return {p, deallocator<Alloc>{alloc}};
        }
        catch (...) {
            allocator_traits::deallocate(alloc, p, 1);
            throw;
        }
    }